

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

size_t check_for_leftover_values
                 (ListNode *map_head,char *error_message,size_t number_of_symbol_names)

{
  int iVar1;
  char *in_RDX;
  ListNode *in_RSI;
  unsigned_long *in_RDI;
  SourceLocation *location;
  ListNode *child_node;
  ListNode *child_list;
  SymbolMapValue *value;
  size_t symbols_with_leftover_values;
  ListNode *current;
  undefined8 *in_stack_ffffffffffffffb8;
  long *in_stack_ffffffffffffffc0;
  long *in_stack_ffffffffffffffc8;
  unsigned_long in_stack_ffffffffffffffd0;
  undefined8 *result;
  size_t local_28;
  unsigned_long *number_of_symbol_names_00;
  
  local_28 = 0;
  _assert_true(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
               (char *)in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  _assert_true(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
               (char *)in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  for (number_of_symbol_names_00 = (unsigned_long *)in_RDI[2]; number_of_symbol_names_00 != in_RDI;
      number_of_symbol_names_00 = (unsigned_long *)number_of_symbol_names_00[2]) {
    result = (undefined8 *)*number_of_symbol_names_00;
    _assert_true((unsigned_long)result,(char *)in_stack_ffffffffffffffc8,
                 (char *)in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    in_stack_ffffffffffffffc8 = result + 1;
    iVar1 = list_empty((ListNode *)0x174326);
    if (iVar1 == 0) {
      if (in_RDX == (char *)0x1) {
        cm_print_error((char *)in_RSI,"%s",*result);
        for (in_stack_ffffffffffffffc0 = (long *)in_stack_ffffffffffffffc8[2];
            in_stack_ffffffffffffffc0 != in_stack_ffffffffffffffc8;
            in_stack_ffffffffffffffc0 = (long *)in_stack_ffffffffffffffc0[2]) {
          in_stack_ffffffffffffffb8 = (undefined8 *)*in_stack_ffffffffffffffc0;
          cm_print_error("%s:%u: note: remaining item was declared here\n",
                         *in_stack_ffffffffffffffb8,(ulong)*(uint *)(in_stack_ffffffffffffffb8 + 1))
          ;
        }
      }
      else {
        cm_print_error("%s: ",*result);
        check_for_leftover_values(in_RSI,in_RDX,(size_t)number_of_symbol_names_00);
      }
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

static size_t check_for_leftover_values(
        const ListNode * const map_head, const char * const error_message,
        const size_t number_of_symbol_names) {
    const ListNode *current;
    size_t symbols_with_leftover_values = 0;
    assert_non_null(map_head);
    assert_true(number_of_symbol_names);

    for (current = map_head->next; current != map_head;
         current = current->next) {
        const SymbolMapValue * const value =
            (SymbolMapValue*)current->value;
        const ListNode *child_list;
        assert_non_null(value);
        child_list = &value->symbol_values_list_head;

        if (!list_empty(child_list)) {
            if (number_of_symbol_names == 1) {
                const ListNode *child_node;
                cm_print_error(error_message, "%s", value->symbol_name);

                for (child_node = child_list->next; child_node != child_list;
                     child_node = child_node->next) {
                    const SourceLocation * const location =
                        (const SourceLocation*)child_node->value;
                    cm_print_error(SOURCE_LOCATION_FORMAT
                                   ": note: remaining item was declared here\n",
                                   location->file, location->line);
                }
            } else {
                cm_print_error("%s: ", value->symbol_name);
                check_for_leftover_values(child_list, error_message,
                                          number_of_symbol_names - 1);
            }
            symbols_with_leftover_values ++;
        }
    }
    return symbols_with_leftover_values;
}